

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O3

bool __thiscall AFakeInventory::TryPickup(AFakeInventory *this,AActor **toucher)

{
  int iVar1;
  
  iVar1 = P_ExecuteSpecial((this->super_AInventory).super_AActor.special,(line_t *)0x0,*toucher,
                           false,(this->super_AInventory).super_AActor.args[0],
                           (this->super_AInventory).super_AActor.args[1],
                           (this->super_AInventory).super_AActor.args[2],
                           (this->super_AInventory).super_AActor.args[3],
                           (this->super_AInventory).super_AActor.args[4]);
  if (iVar1 != 0) {
    AInventory::GoAwayAndDie(&this->super_AInventory);
  }
  return iVar1 != 0;
}

Assistant:

bool TryPickup (AActor *&toucher)
	{
		INTBOOL success = P_ExecuteSpecial(special, NULL, toucher, false,
			args[0], args[1], args[2], args[3], args[4]);

		if (success)
		{
			GoAwayAndDie ();
			return true;
		}
		return false;
	}